

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O0

ProStringList * __thiscall
NmakeMakefileGenerator::extraSubTargetDependencies(NmakeMakefileGenerator *this)

{
  long lVar1;
  char *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProString::ProString(in_RDI,in_RSI);
  ProStringList::ProStringList((ProStringList *)in_RDI,in_stack_ffffffffffffff98);
  ProString::~ProString((ProString *)0x25d2fc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ProStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList NmakeMakefileGenerator::extraSubTargetDependencies()
{
    return { "$(MAKEFILE)" };
}